

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O1

void socket_shutdown_impl(_Bool specify_rdhup)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  uint uVar6;
  uint8_t buf;
  epoll_event event;
  int fds [3];
  undefined1 local_49;
  epoll_event local_48;
  int local_38;
  int local_34;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    pcVar4 = "ep >= 0";
    uVar5 = 0x40d;
  }
  else {
    fd_tcp_socket((int *)((long)&local_48.data + 4));
    local_48.events = (uint)!specify_rdhup << 0xd | 5;
    local_48._4_4_ = local_48.data.u64._4_4_;
    iVar2 = epoll_ctl(iVar1,1,local_48.data.u64._4_4_,&local_48);
    if (iVar2 == 0) {
      uVar6 = (uint)specify_rdhup << 0xd | 5;
      local_48.events = uVar6;
      iVar2 = epoll_ctl(iVar1,3,local_48.data.u64._4_4_,&local_48);
      if (iVar2 == 0) {
        iVar2 = shutdown(local_38,1);
        if (iVar2 == 0) {
          iVar2 = epoll_wait(iVar1,&local_48,1,-1);
          while (iVar2 == 1) {
            fprintf(_stderr,"got event: %x\n",(ulong)local_48.events);
            if (local_48.events != 4) {
              if (local_48.events != uVar6) {
                if (local_48.events == ((uint)specify_rdhup << 0xd | 0x15)) {
                  close(local_48.data.u64._4_4_);
                  iVar2 = epoll_wait(iVar1,&local_48,1,300);
                  if (iVar2 == 0) {
                    iVar2 = close(local_38);
                    if (iVar2 == 0) {
                      if ((local_34 == -1) || (iVar2 = close(local_34), iVar2 == 0)) {
                        iVar1 = close(iVar1);
                        if (iVar1 == 0) {
                          return;
                        }
                        pcVar4 = "close(ep) == 0";
                        uVar5 = 0x443;
                      }
                      else {
                        pcVar4 = "fds[2] == -1 || close(fds[2]) == 0";
                        uVar5 = 0x442;
                      }
                    }
                    else {
                      pcVar4 = "close(fds[1]) == 0";
                      uVar5 = 0x441;
                    }
                  }
                  else {
                    pcVar4 = "epoll_wait(ep, &event, 1, 300) == 0";
                    uVar5 = 0x43f;
                  }
                }
                else {
                  pcVar4 = "false";
                  uVar5 = 0x43b;
                }
                goto LAB_00106d3a;
              }
              sVar3 = read(local_48.data.u64._4_4_,&local_49,1);
              if (sVar3 != 0) {
                pcVar4 = "ret == 0";
                uVar5 = 0x42d;
                goto LAB_00106d3a;
              }
              iVar2 = shutdown(local_48.data.u64._4_4_,1);
              if (iVar2 != 0) {
                pcVar4 = "shutdown(fds[0], SHUT_WR) == 0";
                uVar5 = 0x42f;
                goto LAB_00106d3a;
              }
              shutdown(local_48.data.u64._4_4_,2);
            }
            iVar2 = epoll_wait(iVar1,&local_48,1,-1);
          }
          pcVar4 = "epoll_wait(ep, &event, 1, -1) == 1";
          uVar5 = 0x420;
        }
        else {
          pcVar4 = "shutdown(fds[1], SHUT_WR) == 0";
          uVar5 = 0x41d;
        }
      }
      else {
        pcVar4 = "epoll_ctl(ep, EPOLL_CTL_MOD, fds[0], &event) == 0";
        uVar5 = 0x41b;
      }
    }
    else {
      pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0";
      uVar5 = 0x418;
    }
  }
LAB_00106d3a:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar5,pcVar4);
}

Assistant:

static void
socket_shutdown_impl(bool specify_rdhup)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_tcp_socket(fds);

	uint32_t rdhup_flag = specify_rdhup ? EPOLLRDHUP : 0;

	struct epoll_event event;
	event.events = EPOLLOUT | EPOLLIN | (specify_rdhup ? 0 : EPOLLRDHUP);
	event.data.fd = fds[0];

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0);

	event.events = EPOLLOUT | EPOLLIN | rdhup_flag;
	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_MOD, fds[0], &event) == 0);

	ATF_REQUIRE(shutdown(fds[1], SHUT_WR) == 0);

	for (;;) {
		ATF_REQUIRE(epoll_wait(ep, &event, 1, -1) == 1);

		fprintf(stderr, "got event: %x\n", (int)event.events);

		if (event.events == EPOLLOUT) {
			/* skip spurious event generated by EVFILT_WRITE */
			/* TODO(jan): find a better solution */
			continue;
		}

		if (event.events == (EPOLLOUT | EPOLLIN | rdhup_flag)) {
			uint8_t buf;
			ssize_t ret = read(fds[0], &buf, 1);
			ATF_REQUIRE(ret == 0);

			ATF_REQUIRE(shutdown(fds[0], SHUT_WR) == 0);
			shutdown(fds[0], SHUT_RDWR);
		} else if (event.events ==
		    (EPOLLOUT | EPOLLIN | rdhup_flag | EPOLLHUP)) {
			/* close() may fail here! Don't check return code. */
			close(fds[0]);
			break;
#ifdef __NetBSD__
		} else if (event.events == (EPOLLIN | rdhup_flag)) {
			continue;
#endif
		} else {
			ATF_REQUIRE(false);
		}
	}

	ATF_REQUIRE(epoll_wait(ep, &event, 1, 300) == 0);

	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}